

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O3

course_html_parts ucrcourse_get_html(course_query *query)

{
  char *response;
  course_html_parts cVar1;
  course_html_parts result;
  char *local_20;
  char *local_18;
  
  response = do_request(query);
  if (response == (char *)0x0) {
    local_18 = (char *)0x0;
    local_20 = (char *)0x0;
  }
  else {
    extract_html(response,&local_20,&local_18);
    free(response);
  }
  cVar1.details = local_18;
  cVar1.listings = local_20;
  return cVar1;
}

Assistant:

struct course_html_parts ucrcourse_get_html(const struct course_query *query)
{
	struct course_html_parts result;
	char *response;

	response = ucrcourse_get_raw(query);
	if (!response) {
		result.listings = NULL;
		result.details = NULL;
		return result;
	}

	extract_html(response, &result.listings, &result.details);
	free(response);
	return result;
}